

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O0

void char_test(char *filename,FILE *fp)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ptrlen pVar4;
  ptrlen pVar5;
  int local_154;
  char *chrstr_1;
  ptrlen chr_1;
  ptrlen pl_2;
  char *chrstr;
  ptrlen chr;
  ptrlen pl_1;
  uint para_dir;
  char *para_dir_str;
  void *pvStack_e8;
  int override;
  size_t local_e0;
  void *local_a8;
  size_t local_a0;
  undefined1 local_98 [8];
  ptrlen pl;
  ptrlen order_pl;
  ptrlen para_dir_pl;
  ptrlen input_pl;
  char *line;
  uint *order;
  size_t order_len;
  size_t order_size;
  bidi_char *bcs;
  size_t bcs_len;
  size_t bcs_size;
  FILE *pFStack_18;
  uint lineno;
  FILE *fp_local;
  char *filename_local;
  
  bcs_size._4_4_ = 0;
  bcs_len = 0;
  bcs = (bidi_char *)0x0;
  order_size = 0;
  order_len = 0;
  line = (char *)0x0;
  pFStack_18 = fp;
  fp_local = (FILE *)filename;
  while( true ) {
    bcs_size._4_4_ = bcs_size._4_4_ + 1;
    pcVar1 = fgetline(pFStack_18);
    pcVar1 = chomp(pcVar1);
    if (pcVar1 == (char *)0x0) break;
    if ((*pcVar1 == '\0') || (*pcVar1 == '#')) {
      safefree(pcVar1);
    }
    else {
      _local_98 = ptrlen_from_asciz(pcVar1);
      pVar4 = ptrlen_get_word((ptrlen *)local_98,";");
      local_a8 = pVar4.ptr;
      local_a0 = pVar4.len;
      pVar4 = ptrlen_get_word((ptrlen *)local_98,";");
      ptrlen_get_word((ptrlen *)local_98,";");
      ptrlen_get_word((ptrlen *)local_98,";");
      pVar5 = ptrlen_get_word((ptrlen *)local_98,";");
      pvStack_e8 = pVar5.ptr;
      pl.len = (size_t)pvStack_e8;
      local_e0 = pVar5.len;
      pcVar2 = mkstr(pVar4);
      uVar3 = strtoul(pcVar2,(char **)0x0,0);
      safefree(pcVar2);
      if ((int)uVar3 == 0) {
        local_154 = 1;
      }
      else {
        local_154 = 0;
        if ((int)uVar3 == 1) {
          local_154 = -1;
        }
      }
      bcs = (bidi_char *)0x0;
      chr.len = (size_t)local_a8;
      while (local_a0 != 0) {
        pVar4 = ptrlen_get_word((ptrlen *)&chr.len," ");
        pcVar2 = mkstr(pVar4);
        order_size = (size_t)safegrowarray((void *)order_size,&bcs_len,0xc,(size_t)bcs,1,false);
        uVar3 = strtoul(pcVar2,(char **)0x0,0x10);
        *(int *)(order_size + (long)bcs * 0xc + 4) = (int)uVar3;
        *(undefined4 *)(order_size + (long)bcs * 0xc) =
             *(undefined4 *)(order_size + (long)bcs * 0xc + 4);
        *(short *)(order_size + (long)bcs * 0xc + 8) = (short)bcs;
        *(undefined2 *)(order_size + (long)bcs * 0xc + 10) = 1;
        bcs = (bidi_char *)((long)&bcs->origwc + 1);
        safefree(pcVar2);
      }
      order = (uint *)0x0;
      chr_1.len = pl.len;
      while (local_e0 != 0) {
        pVar4 = ptrlen_get_word((ptrlen *)&chr_1.len," ");
        pcVar2 = mkstr(pVar4);
        line = (char *)safegrowarray(line,&order_len,4,(size_t)order,1,false);
        uVar3 = strtoul(pcVar2,(char **)0x0,0);
        *(int *)(line + (long)order * 4) = (int)uVar3;
        safefree(pcVar2);
        order = (uint *)((long)order + 1);
      }
      run_test((char *)fp_local,bcs_size._4_4_,(bidi_char *)order_size,(size_t)bcs,(uint *)line,
               (size_t)order,local_154);
      safefree(pcVar1);
    }
  }
  safefree((void *)order_size);
  safefree(line);
  return;
}

Assistant:

static void char_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Break each test line up into its main fields */
        ptrlen input_pl, para_dir_pl, order_pl;
        {
            ptrlen pl = ptrlen_from_asciz(line);
            input_pl = ptrlen_get_word(&pl, ";");
            para_dir_pl = ptrlen_get_word(&pl, ";");
            ptrlen_get_word(&pl, ";"); /* paragraph level, which we ignore */
            ptrlen_get_word(&pl, ";"); /* embedding levels, which we ignore */
            order_pl = ptrlen_get_word(&pl, ";");
        }

        int override;
        {
            char *para_dir_str = mkstr(para_dir_pl);
            unsigned para_dir = strtoul(para_dir_str, NULL, 0);
            sfree(para_dir_str);

            override = (para_dir == 0 ? +1 : para_dir == 1 ? -1 : 0);
        }

        /* Break up the input into Unicode characters */
        bcs_len = 0;
        {
            ptrlen pl = input_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(bcs, bcs_size, bcs_len);
                bcs[bcs_len].wc = strtoul(chrstr, NULL, 16);
                bcs[bcs_len].origwc = bcs[bcs_len].wc;
                bcs[bcs_len].index = bcs_len;
                bcs[bcs_len].nchars = 1;
                bcs_len++;
                sfree(chrstr);
            }
        }

        /* Ditto the expected output order */
        order_len = 0;
        {
            ptrlen pl = order_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(chrstr, NULL, 0);
                sfree(chrstr);
            }
        }

        run_test(filename, lineno, bcs, bcs_len, order, order_len, override);
        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}